

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue
          (BinaryAnnotator *this,uint32_t enum_id,uint8_t value)

{
  uint uVar1;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar2;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_01;
  Enum *enum_def;
  uint8_t value_local;
  uint32_t enum_id_local;
  BinaryAnnotator *this_local;
  
  pVVar2 = reflection::Schema::enums(this->schema_);
  uVar1 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::size(pVVar2);
  if (enum_id < uVar1) {
    pVVar2 = reflection::Schema::enums(this->schema_);
    this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(pVVar2,enum_id);
    if (this_00 == (return_type)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_01 = reflection::Enum::values(this_00);
      uVar1 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::size(this_01);
      this_local._7_1_ = value < uVar1;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsValidUnionValue(const uint32_t enum_id, const uint8_t value) {
    if (enum_id >= schema_->enums()->size()) { return false; }

    const reflection::Enum *enum_def = schema_->enums()->Get(enum_id);

    if (enum_def == nullptr) { return false; }

    return value < enum_def->values()->size();
  }